

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O0

void lts2::WaveletCoef_Biortho(string *name,double **P,double **Q,int *fsizeP,int *fsizeQ)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double sq;
  double *q;
  double *p;
  int *fsizeQ_local;
  int *fsizeP_local;
  double **Q_local;
  double **P_local;
  string *name_local;
  
  q = (double *)0x0;
  sq = 0.0;
  free(*P);
  free(*Q);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = strcmp(pcVar4,"9-7");
  if (iVar3 != 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar3 = strcmp(pcVar4,"9/7");
    if (iVar3 != 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar3 = strcmp(pcVar4,"5-3");
      if (iVar3 != 0) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar3 = strcmp(pcVar4,"5/3");
        if (iVar3 != 0) goto LAB_00117b08;
      }
      *fsizeP = 5;
      *fsizeQ = 3;
      q = (double *)operator_new__(0x28);
      sq = (double)operator_new__(0x18);
      dVar6 = sqrt(2.0);
      dVar6 = dVar6 * 2.0;
      dVar7 = -1.0 / (dVar6 * 2.0);
      q[4] = dVar7;
      *q = dVar7;
      dVar7 = 1.0 / dVar6;
      *(double *)((long)sq + 0x10) = dVar7;
      *(double *)sq = dVar7;
      q[3] = dVar7;
      q[1] = dVar7;
      q[2] = 3.0 / dVar6;
      *(double *)((long)sq + 8) = 2.0 / dVar6;
      goto LAB_00117b08;
    }
  }
  *fsizeP = 9;
  *fsizeQ = 7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*fsizeP;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  q = (double *)operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*fsizeQ;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  sq = (double)operator_new__(uVar5);
  *q = 0.02674875741081;
  q[1] = -0.01686411844287;
  q[2] = -0.07822326652899;
  q[3] = 0.26686411844287;
  q[4] = 0.60294901823636;
  q[5] = 0.26686411844287;
  q[6] = -0.07822326652899;
  q[7] = -0.01686411844287;
  q[8] = 0.02674875741081;
  *(undefined8 *)sq = 0x3fa75d96159fbed8;
  *(undefined8 *)((long)sq + 8) = 0xbf9d7658567ef01f;
  *(undefined8 *)((long)sq + 0x10) = 0xbfd2ebb2c2b3f7db;
  *(undefined8 *)((long)sq + 0x18) = 0x3fe1d7658567ef02;
  *(undefined8 *)((long)sq + 0x20) = 0xbfd2ebb2c2b3f7db;
  *(undefined8 *)((long)sq + 0x28) = 0xbf9d7658567ef01f;
  *(undefined8 *)((long)sq + 0x30) = 0x3fa75d96159fbed8;
LAB_00117b08:
  *P = q;
  *Q = (double *)sq;
  return;
}

Assistant:

void lts2::WaveletCoef_Biortho(const std::string& name,double **P,double **Q,int *fsizeP, int *fsizeQ) {
	
  double *p = NULL;
  double *q = NULL;
  double sq;
	
  free(*P);
  free(*Q);
	
  if (!strcmp(name.c_str(),"9-7") || !strcmp(name.c_str(),"9/7")) {
    *fsizeP = 9;
    *fsizeQ = 7;
		
    p = new double[*fsizeP];
    q = new double[*fsizeQ];
		
    p[0] =   0.02674875741081;
    p[1] =  -0.01686411844287;
    p[2] =  -0.07822326652899;
    p[3] =   0.26686411844287;
    p[4] =   0.60294901823636;
    p[5] =   0.26686411844287;
    p[6] =  -0.07822326652899;
    p[7] =  -0.01686411844287;
    p[8] =   0.02674875741081;
		
    q[0] =   0.04563588155713;
    q[1] =  -0.02877176311425;
    q[2] =  -0.29563588155713;
    q[3] =   0.55754352622850;
    q[4] =  -0.29563588155713;
    q[5] =  -0.02877176311425;
    q[6] =   0.04563588155713;
		
    /*
      p[0] = 0.037828455506995; 
      p[1] = -0.023849465019380;
      p[2] = -0.11062440441842;
      p[3] = 0.37740285561265;
      p[4] = 0.85269867900940;
      p[5] = 0.37740285561265;
      p[6] = -0.11062440441842;
      p[7] = -0.023849465019380;
      p[8] = 0.037828455506995;
		 
      q[0] = -0.064538882628938;
      q[1] = -0.040689417609558;
      q[2] = 0.41809227322221;
      q[3] = 0.78848561640566;
      q[4] = 0.41809227322221;
      q[5] = -0.040689417609558;
      q[6] = -0.064538882628938;
    */
		
  } else if (!strcmp(name.c_str(),"5-3") || !strcmp(name.c_str(),"5/3")) {
    *fsizeP = 5;
    *fsizeQ = 3;
		
    p = new double[5];
    q = new double[3];
		
    sq = 2*sqrt(2);  
		
    p[0] = p[4] = -1/(2*sq);
    p[1] = p[3] = q[0] = q[2] = 1/sq;
    p[2] = 3/sq;
		
    q[1] = 2/sq;
  }
	
  *P = p;
  *Q = q;
	
  return;
}